

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O1

qpTestResult
glu::TextureTestUtil::compareGenMipmapResult
          (TestLog *log,TextureCube *resultTexture,TextureCube *level0Reference,
          GenMipmapPrecision *precision)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  pointer pPVar3;
  _Alloc_hider imageSetName;
  bool bVar4;
  int i;
  int iVar5;
  long lVar6;
  MessageBuilder *pMVar7;
  long *plVar8;
  size_t sVar9;
  undefined8 *puVar10;
  size_type *psVar11;
  TestLog *pTVar12;
  GenMipmapPrecision *precision_00;
  ulong *puVar13;
  ConstPixelBufferAccess *access;
  Surface *surface;
  void *__buf;
  void *__buf_00;
  qpTestResult qVar14;
  qpTestResult qVar15;
  int iVar16;
  MessageBuilder *pMVar17;
  ulong uVar18;
  MessageBuilder *pMVar19;
  void *pvVar20;
  long lVar21;
  Vec4 threshold;
  Surface errorMask;
  ConstPixelBufferAccess dst;
  ConstPixelBufferAccess src;
  long local_498;
  allocator<char> local_479;
  string local_478;
  TestLog *local_450;
  Surface local_448;
  LogImageSet local_430;
  long *local_3f0;
  undefined8 local_3e8;
  long local_3e0;
  undefined8 uStack_3d8;
  long *local_3d0;
  undefined8 local_3c8;
  long local_3c0;
  undefined8 uStack_3b8;
  long *local_3b0;
  undefined8 local_3a8;
  long local_3a0;
  undefined8 uStack_398;
  GenMipmapPrecision *local_390;
  ulong *local_388;
  long local_380;
  ulong local_378;
  long lStack_370;
  ulong *local_368;
  long local_360;
  ulong local_358;
  long lStack_350;
  ConstPixelBufferAccess local_348;
  ulong *local_320;
  long local_318;
  ulong local_310 [2];
  ulong *local_300;
  long local_2f8;
  ulong local_2f0 [2];
  ulong *local_2e0;
  long local_2d8;
  ulong local_2d0 [2];
  ulong *local_2c0;
  long local_2b8;
  ulong local_2b0 [2];
  ulong *local_2a0;
  long local_298;
  ulong local_290 [2];
  ulong *local_280;
  long local_278;
  ulong local_270 [2];
  TextureCube *local_260;
  long local_258;
  long local_250;
  long local_248;
  string local_240;
  ConstPixelBufferAccess local_220;
  string local_1f8;
  string local_1d8;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *local_1b8;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  TestLog local_1a0;
  long lStack_198;
  long *local_190;
  long local_180 [8];
  ios_base local_140 [8];
  ios_base local_138 [264];
  
  lVar21 = 0;
  qVar14 = QP_TEST_RESULT_PASS;
  local_450 = log;
  local_390 = precision;
  local_260 = resultTexture;
  do {
    lVar6 = 0;
    do {
      *(undefined4 *)(local_1b0 + lVar6 * 4) = 0x3f800000;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    local_478._M_dataplus._M_p = (pointer)0x0;
    local_478._M_string_length = 0;
    lVar6 = 0;
    pMVar7 = (MessageBuilder *)&precision->colorThreshold;
    pMVar19 = (MessageBuilder *)local_1b0;
    do {
      pMVar17 = pMVar7;
      if ((local_390->colorMask).m_data[lVar6] == false) {
        pMVar17 = pMVar19;
      }
      *(undefined4 *)((long)&local_478._M_dataplus._M_p + lVar6 * 4) =
           *(undefined4 *)&pMVar17->m_log;
      lVar6 = lVar6 + 1;
      pMVar19 = (MessageBuilder *)((long)&pMVar19->m_log + 4);
      pMVar7 = (MessageBuilder *)((long)&pMVar7->m_log + 4);
    } while (lVar6 != 4);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
    std::ostream::operator<<((MessageBuilder *)local_1b0,(int)lVar21);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
    std::ios_base::~ios_base(local_140);
    plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_220,0,(char *)0x0,0x1cfa84f);
    local_430.m_name._M_dataplus._M_p = (pointer)&local_430.m_name.field_2;
    psVar11 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_430.m_name.field_2._M_allocated_capacity = *psVar11;
      local_430.m_name.field_2._8_4_ = (undefined4)plVar8[3];
      local_430.m_name.field_2._12_4_ = *(undefined4 *)((long)(plVar8 + 3) + 4);
    }
    else {
      local_430.m_name.field_2._M_allocated_capacity = *psVar11;
      local_430.m_name._M_dataplus._M_p = (pointer)*plVar8;
    }
    imageSetName._M_p = local_430.m_name._M_dataplus._M_p;
    local_430.m_name._M_string_length = plVar8[1];
    *plVar8 = (long)psVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    local_348.m_format = (TextureFormat)(local_348.m_size.m_data + 2);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"Level 0, face ","");
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_348);
    local_1b0 = (undefined1  [8])&local_1a0;
    pTVar12 = (TestLog *)(plVar8 + 2);
    if ((TestLog *)*plVar8 == pTVar12) {
      local_1a0.m_log = pTVar12->m_log;
      lStack_198 = plVar8[3];
    }
    else {
      local_1a0.m_log = pTVar12->m_log;
      local_1b0 = (undefined1  [8])*plVar8;
    }
    local_1a8 = (_func_int **)plVar8[1];
    *plVar8 = (long)pTVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    bVar4 = tcu::floatThresholdCompare
                      (local_450,imageSetName._M_p,(char *)local_1b0,
                       &(level0Reference->m_access[lVar21].
                         super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                         ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess,
                       &(resultTexture->m_access[lVar21].
                         super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                         ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess,
                       (Vec4 *)&local_478,COMPARE_LOG_RESULT);
    if (local_1b0 != (undefined1  [8])&local_1a0) {
      operator_delete((void *)local_1b0,(ulong)((long)&(local_1a0.m_log)->flags + 1));
    }
    if (local_348.m_format != (TextureFormat)(local_348.m_size.m_data + 2)) {
      operator_delete((void *)local_348.m_format,local_348._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430.m_name._M_dataplus._M_p != &local_430.m_name.field_2) {
      operator_delete(local_430.m_name._M_dataplus._M_p,
                      local_430.m_name.field_2._M_allocated_capacity + 1);
    }
    if (local_220.m_format != (TextureFormat)(local_220.m_size.m_data + 2)) {
      operator_delete((void *)local_220.m_format,local_220._16_8_ + 1);
    }
    if (!bVar4) {
      local_1b0 = (undefined1  [8])local_450;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"ERROR: Level 0, face ",0x15);
      pcVar2 = compareGenMipmapResult::s_faceNames[lVar21];
      sVar9 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar2,sVar9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8," comparison failed!",0x13);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      qVar14 = QP_TEST_RESULT_FAIL;
    }
    lVar21 = lVar21 + 1;
  } while (lVar21 != 6);
  if (1 < (int)((ulong)((long)local_260->m_access[0].
                              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_260->m_access[0].
                             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333) {
    local_1b8 = local_260->m_access;
    local_498 = 1;
    local_248 = 0x30;
    local_250 = 0x3c;
    local_258 = 0;
    do {
      lVar21 = 0;
      do {
        pcVar2 = compareGenMipmapResult::s_faceNames[lVar21];
        pPVar3 = local_1b8[lVar21].
                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_220.m_format = *(TextureFormat *)(pPVar3 + local_498 + -1);
        lVar6 = 2;
        do {
          local_220.m_size.m_data[lVar6 + -2] =
               *(int *)((long)(pPVar3->super_ConstPixelBufferAccess).m_size.m_data +
                       lVar6 * 4 + local_258 + -8);
          lVar6 = lVar6 + 1;
        } while (lVar6 != 5);
        lVar6 = 5;
        do {
          local_220.m_size.m_data[lVar6 + -2] =
               *(int *)((long)(pPVar3->super_ConstPixelBufferAccess).m_size.m_data +
                       lVar6 * 4 + local_258 + -8);
          lVar6 = lVar6 + 1;
        } while (lVar6 != 8);
        local_220.m_data = pPVar3[local_498 + -1].super_ConstPixelBufferAccess.m_data;
        local_348.m_format = *(TextureFormat *)(pPVar3 + local_498);
        lVar6 = 0;
        do {
          local_348.m_size.m_data[lVar6] =
               *(int *)((long)(pPVar3->super_ConstPixelBufferAccess).m_size.m_data +
                       lVar6 * 4 + local_248 + -8);
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
        lVar6 = 0;
        do {
          local_348.m_pitch.m_data[lVar6] =
               *(int *)((long)(pPVar3->super_ConstPixelBufferAccess).m_size.m_data +
                       lVar6 * 4 + local_250 + -8);
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
        local_348.m_data = pPVar3[local_498].super_ConstPixelBufferAccess.m_data;
        tcu::Surface::Surface(&local_448,local_348.m_size.m_data[0],local_348.m_size.m_data[1]);
        local_430.m_name._M_dataplus._M_p = (pointer)0x300000008;
        pvVar20 = (void *)local_448.m_pixels.m_cap;
        if ((void *)local_448.m_pixels.m_cap != (void *)0x0) {
          pvVar20 = local_448.m_pixels.m_ptr;
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_430,local_448.m_width,
                   local_448.m_height,1,pvVar20);
        iVar5 = compareGenMipmapBilinear
                          (&local_348,&local_220,(PixelBufferAccess *)local_1b0,local_390);
        bVar4 = iVar5 == 0;
        iVar16 = (int)local_498;
        if (!bVar4) {
          local_1b0 = (undefined1  [8])local_450;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,"WARNING: Level ",0xf);
          std::ostream::operator<<((ostringstream *)&local_1a8,iVar16);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", face ",7);
          sVar9 = strlen(pcVar2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar2,sVar9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8," comparison to bilinear method failed, found ",0x2d);
          std::ostream::operator<<((ostringstream *)&local_1a8,iVar5);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8," invalid pixels.",0x10);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
          std::ios_base::~ios_base(local_138);
          local_430.m_name._M_dataplus._M_p = (pointer)0x300000008;
          pvVar20 = (void *)local_448.m_pixels.m_cap;
          if ((void *)local_448.m_pixels.m_cap != (void *)0x0) {
            pvVar20 = local_448.m_pixels.m_ptr;
          }
          tcu::PixelBufferAccess::PixelBufferAccess
                    ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_430,local_448.m_width,
                     local_448.m_height,1,pvVar20);
          iVar5 = compareGenMipmapBox(&local_348,&local_220,(PixelBufferAccess *)local_1b0,local_390
                                     );
          if (iVar5 == 0) {
            bVar4 = true;
          }
          else {
            local_1b0 = (undefined1  [8])local_450;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,"WARNING: Level ",0xf);
            std::ostream::operator<<((ostringstream *)&local_1a8,iVar16);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", face ",7);
            sVar9 = strlen(pcVar2);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar2,sVar9);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8," comparison to box method failed, found ",0x28);
            std::ostream::operator<<((ostringstream *)&local_1a8,iVar5);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8," invalid pixels.",0x10);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
            std::ios_base::~ios_base(local_138);
          }
        }
        qVar15 = QP_TEST_RESULT_QUALITY_WARNING;
        if (qVar14 != QP_TEST_RESULT_PASS) {
          qVar15 = qVar14;
        }
        if (!bVar4) {
          local_430.m_name._M_dataplus._M_p = (pointer)0x300000008;
          pvVar20 = (void *)local_448.m_pixels.m_cap;
          if ((void *)local_448.m_pixels.m_cap != (void *)0x0) {
            pvVar20 = local_448.m_pixels.m_ptr;
          }
          precision_00 = (GenMipmapPrecision *)(ulong)(uint)local_448.m_height;
          tcu::PixelBufferAccess::PixelBufferAccess
                    ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_430,local_448.m_width,
                     local_448.m_height,1,pvVar20);
          iVar5 = compareGenMipmapVeryLenient
                            (&local_348,&local_220,(PixelBufferAccess *)local_1b0,precision_00);
          qVar14 = qVar15;
          if (iVar5 == 0) {
            bVar4 = true;
          }
          else {
            local_1b0 = (undefined1  [8])local_450;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,"ERROR: Level ",0xd);
            std::ostream::operator<<((ostringstream *)&local_1a8,iVar16);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", face ",7);
            sVar9 = strlen(pcVar2);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar2,sVar9);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8," appears to contain ",0x14);
            std::ostream::operator<<((ostringstream *)&local_1a8,iVar5);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8," completely wrong pixels, failing case!",0x27);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
            std::ios_base::~ios_base(local_138);
          }
        }
        if (!bVar4) {
          qVar14 = QP_TEST_RESULT_FAIL;
        }
        local_300 = local_2f0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"Level","");
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
        std::ostream::operator<<((MessageBuilder *)local_1b0,iVar16);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
        std::ios_base::~ios_base(local_140);
        uVar18 = 0xf;
        if (local_300 != local_2f0) {
          uVar18 = local_2f0[0];
        }
        if (uVar18 < (ulong)(local_278 + local_2f8)) {
          uVar18 = 0xf;
          if (local_280 != local_270) {
            uVar18 = local_270[0];
          }
          if (uVar18 < (ulong)(local_278 + local_2f8)) goto LAB_0190a23a;
          puVar10 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_280,0,(char *)0x0,(ulong)local_300);
        }
        else {
LAB_0190a23a:
          puVar10 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_280);
        }
        local_3b0 = &local_3a0;
        plVar8 = puVar10 + 2;
        if ((long *)*puVar10 == plVar8) {
          local_3a0 = *plVar8;
          uStack_398 = puVar10[3];
        }
        else {
          local_3a0 = *plVar8;
          local_3b0 = (long *)*puVar10;
        }
        local_3a8 = puVar10[1];
        *puVar10 = plVar8;
        puVar10[1] = 0;
        *(undefined1 *)plVar8 = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_3b0);
        local_368 = &local_358;
        puVar13 = (ulong *)(plVar8 + 2);
        if ((ulong *)*plVar8 == puVar13) {
          local_358 = *puVar13;
          lStack_350 = plVar8[3];
        }
        else {
          local_358 = *puVar13;
          local_368 = (ulong *)*plVar8;
        }
        local_360 = plVar8[1];
        *plVar8 = (long)puVar13;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
        std::ostream::operator<<((MessageBuilder *)local_1b0,(int)lVar21);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
        std::ios_base::~ios_base(local_140);
        uVar18 = 0xf;
        if (local_368 != &local_358) {
          uVar18 = local_358;
        }
        if (uVar18 < (ulong)(local_298 + local_360)) {
          uVar18 = 0xf;
          if (local_2a0 != local_290) {
            uVar18 = local_290[0];
          }
          if (uVar18 < (ulong)(local_298 + local_360)) goto LAB_0190a3c1;
          puVar10 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_2a0,0,(char *)0x0,(ulong)local_368);
        }
        else {
LAB_0190a3c1:
          puVar10 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_368,(ulong)local_2a0);
        }
        local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
        psVar11 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_478.field_2._M_allocated_capacity = *psVar11;
          local_478.field_2._8_4_ = *(undefined4 *)(puVar10 + 3);
          local_478.field_2._12_4_ = *(undefined4 *)((long)puVar10 + 0x1c);
        }
        else {
          local_478.field_2._M_allocated_capacity = *psVar11;
          local_478._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_478._M_string_length = puVar10[1];
        *puVar10 = psVar11;
        puVar10[1] = 0;
        *(undefined1 *)psVar11 = 0;
        local_320 = local_310;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"Level ","");
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
        std::ostream::operator<<((MessageBuilder *)local_1b0,iVar16);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
        std::ios_base::~ios_base(local_140);
        uVar18 = 0xf;
        if (local_320 != local_310) {
          uVar18 = local_310[0];
        }
        if (uVar18 < (ulong)(local_2b8 + local_318)) {
          uVar18 = 0xf;
          if (local_2c0 != local_2b0) {
            uVar18 = local_2b0[0];
          }
          if (uVar18 < (ulong)(local_2b8 + local_318)) goto LAB_0190a502;
          puVar10 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_2c0,0,(char *)0x0,(ulong)local_320);
        }
        else {
LAB_0190a502:
          puVar10 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_320,(ulong)local_2c0);
        }
        local_3f0 = &local_3e0;
        plVar8 = puVar10 + 2;
        if ((long *)*puVar10 == plVar8) {
          local_3e0 = *plVar8;
          uStack_3d8 = puVar10[3];
        }
        else {
          local_3e0 = *plVar8;
          local_3f0 = (long *)*puVar10;
        }
        local_3e8 = puVar10[1];
        *puVar10 = plVar8;
        puVar10[1] = 0;
        *(undefined1 *)plVar8 = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_3f0);
        local_388 = &local_378;
        puVar13 = (ulong *)(plVar8 + 2);
        if ((ulong *)*plVar8 == puVar13) {
          local_378 = *puVar13;
          lStack_370 = plVar8[3];
        }
        else {
          local_378 = *puVar13;
          local_388 = (ulong *)*plVar8;
        }
        local_380 = plVar8[1];
        *plVar8 = (long)puVar13;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e0,pcVar2,&local_479);
        pTVar12 = local_450;
        uVar18 = 0xf;
        if (local_388 != &local_378) {
          uVar18 = local_378;
        }
        if (uVar18 < (ulong)(local_2d8 + local_380)) {
          uVar18 = 0xf;
          if (local_2e0 != local_2d0) {
            uVar18 = local_2d0[0];
          }
          if (uVar18 < (ulong)(local_2d8 + local_380)) goto LAB_0190a663;
          puVar10 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_2e0,0,(char *)0x0,(ulong)local_388);
        }
        else {
LAB_0190a663:
          puVar10 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_388,(ulong)local_2e0);
        }
        local_3d0 = &local_3c0;
        plVar8 = puVar10 + 2;
        if ((long *)*puVar10 == plVar8) {
          local_3c0 = *plVar8;
          uStack_3b8 = puVar10[3];
        }
        else {
          local_3c0 = *plVar8;
          local_3d0 = (long *)*puVar10;
        }
        local_3c8 = puVar10[1];
        *puVar10 = plVar8;
        puVar10[1] = 0;
        *(undefined1 *)plVar8 = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_3d0);
        local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
        psVar11 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_240.field_2._M_allocated_capacity = *psVar11;
          local_240.field_2._8_8_ = plVar8[3];
        }
        else {
          local_240.field_2._M_allocated_capacity = *psVar11;
          local_240._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_240._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        tcu::LogImageSet::LogImageSet(&local_430,&local_478,&local_240);
        tcu::TestLog::startImageSet
                  (pTVar12,local_430.m_name._M_dataplus._M_p,
                   local_430.m_description._M_dataplus._M_p);
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"Result","");
        local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"Result","");
        access = &local_348;
        tcu::LogImage::LogImage
                  ((LogImage *)local_1b0,&local_1f8,&local_1d8,access,QP_IMAGE_COMPRESSION_MODE_BEST
                  );
        tcu::LogImage::write((LogImage *)local_1b0,(int)pTVar12,__buf,(size_t)access);
        if (local_190 != local_180) {
          operator_delete(local_190,local_180[0] + 1);
        }
        if (local_1b0 != (undefined1  [8])&local_1a0) {
          operator_delete((void *)local_1b0,(ulong)((long)&(local_1a0.m_log)->flags + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_430.m_description._M_dataplus._M_p != &local_430.m_description.field_2) {
          operator_delete(local_430.m_description._M_dataplus._M_p,
                          local_430.m_description.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_430.m_name._M_dataplus._M_p != &local_430.m_name.field_2) {
          operator_delete(local_430.m_name._M_dataplus._M_p,
                          local_430.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != &local_240.field_2) {
          operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
        }
        if (local_3d0 != &local_3c0) {
          operator_delete(local_3d0,local_3c0 + 1);
        }
        if (local_2e0 != local_2d0) {
          operator_delete(local_2e0,local_2d0[0] + 1);
        }
        if (local_388 != &local_378) {
          operator_delete(local_388,local_378 + 1);
        }
        if (local_3f0 != &local_3e0) {
          operator_delete(local_3f0,local_3e0 + 1);
        }
        if (local_2c0 != local_2b0) {
          operator_delete(local_2c0,local_2b0[0] + 1);
        }
        if (local_320 != local_310) {
          operator_delete(local_320,local_310[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_478._M_dataplus._M_p != &local_478.field_2) {
          operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
        }
        if (local_2a0 != local_290) {
          operator_delete(local_2a0,local_290[0] + 1);
        }
        if (local_368 != &local_358) {
          operator_delete(local_368,local_358 + 1);
        }
        if (local_3b0 != &local_3a0) {
          operator_delete(local_3b0,local_3a0 + 1);
        }
        if (local_280 != local_270) {
          operator_delete(local_280,local_270[0] + 1);
        }
        if (local_300 != local_2f0) {
          operator_delete(local_300,local_2f0[0] + 1);
        }
        paVar1 = &local_430.m_name.field_2;
        if (!bVar4) {
          local_430.m_name._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"ErrorMask","");
          local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"Error mask","");
          surface = &local_448;
          tcu::LogImage::LogImage
                    ((LogImage *)local_1b0,&local_430.m_name,&local_478,surface,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write((LogImage *)local_1b0,(int)pTVar12,__buf_00,(size_t)surface);
          if (local_190 != local_180) {
            operator_delete(local_190,local_180[0] + 1);
          }
          if (local_1b0 != (undefined1  [8])&local_1a0) {
            operator_delete((void *)local_1b0,(ulong)((long)&(local_1a0.m_log)->flags + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_478._M_dataplus._M_p != &local_478.field_2) {
            operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_430.m_name._M_dataplus._M_p != paVar1) {
            operator_delete(local_430.m_name._M_dataplus._M_p,
                            local_430.m_name.field_2._M_allocated_capacity + 1);
          }
        }
        tcu::TestLog::endImageSet(pTVar12);
        tcu::Surface::~Surface(&local_448);
        lVar21 = lVar21 + 1;
      } while (lVar21 != 6);
      local_498 = local_498 + 1;
      local_258 = local_258 + 0x28;
      local_248 = local_248 + 0x28;
      local_250 = local_250 + 0x28;
    } while (local_498 <
             (int)((ulong)((long)local_260->m_access[0].
                                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_260->m_access[0].
                                super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333);
  }
  return qVar14;
}

Assistant:

qpTestResult compareGenMipmapResult (tcu::TestLog& log, const tcu::TextureCube& resultTexture, const tcu::TextureCube& level0Reference, const GenMipmapPrecision& precision)
{
	qpTestResult result = QP_TEST_RESULT_PASS;

	static const char* s_faceNames[] = { "-X", "+X", "-Y", "+Y", "-Z", "+Z" };
	DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(s_faceNames) == tcu::CUBEFACE_LAST);

	// Special comparison for level 0.
	for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
	{
		const tcu::CubeFace	face		= tcu::CubeFace(faceNdx);
		const tcu::Vec4		threshold	= select(precision.colorThreshold, tcu::Vec4(1.0f), precision.colorMask);
		const bool			level0Ok	= tcu::floatThresholdCompare(log,
																	 ("Level0Face" + de::toString(faceNdx)).c_str(),
																	 (string("Level 0, face ") + s_faceNames[face]).c_str(),
																	 level0Reference.getLevelFace(0, face),
																	 resultTexture.getLevelFace(0, face),
																	 threshold, tcu::COMPARE_LOG_RESULT);

		if (!level0Ok)
		{
			log << tcu::TestLog::Message << "ERROR: Level 0, face " << s_faceNames[face] << " comparison failed!" << tcu::TestLog::EndMessage;
			result = QP_TEST_RESULT_FAIL;
		}
	}

	for (int levelNdx = 1; levelNdx < resultTexture.getNumLevels(); levelNdx++)
	{
		for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
		{
			const tcu::CubeFace					face		= tcu::CubeFace(faceNdx);
			const char*							faceName	= s_faceNames[face];
			const tcu::ConstPixelBufferAccess	src			= resultTexture.getLevelFace(levelNdx-1,	face);
			const tcu::ConstPixelBufferAccess	dst			= resultTexture.getLevelFace(levelNdx,		face);
			tcu::Surface						errorMask	(dst.getWidth(), dst.getHeight());
			bool								levelOk		= false;

			// Try different comparisons in quality order.

			if (!levelOk)
			{
				const int numFailed = compareGenMipmapBilinear(dst, src, errorMask.getAccess(), precision);
				if (numFailed == 0)
					levelOk = true;
				else
					log << tcu::TestLog::Message << "WARNING: Level " << levelNdx << ", face " << faceName << " comparison to bilinear method failed, found " << numFailed << " invalid pixels." << tcu::TestLog::EndMessage;
			}

			if (!levelOk)
			{
				const int numFailed = compareGenMipmapBox(dst, src, errorMask.getAccess(), precision);
				if (numFailed == 0)
					levelOk = true;
				else
					log << tcu::TestLog::Message << "WARNING: Level " << levelNdx << ", face " << faceName <<" comparison to box method failed, found " << numFailed << " invalid pixels." << tcu::TestLog::EndMessage;
			}

			// At this point all high-quality methods have been used.
			if (!levelOk && result == QP_TEST_RESULT_PASS)
				result = QP_TEST_RESULT_QUALITY_WARNING;

			if (!levelOk)
			{
				const int numFailed = compareGenMipmapVeryLenient(dst, src, errorMask.getAccess(), precision);
				if (numFailed == 0)
					levelOk = true;
				else
					log << tcu::TestLog::Message << "ERROR: Level " << levelNdx << ", face " << faceName << " appears to contain " << numFailed << " completely wrong pixels, failing case!" << tcu::TestLog::EndMessage;
			}

			if (!levelOk)
				result = QP_TEST_RESULT_FAIL;

			log << tcu::TestLog::ImageSet(string("Level") + de::toString(levelNdx) + "Face" + de::toString(faceNdx), string("Level ") + de::toString(levelNdx) + ", face " + string(faceName) + " result")
				<< tcu::TestLog::Image("Result", "Result", dst);

			if (!levelOk)
				log << tcu::TestLog::Image("ErrorMask", "Error mask", errorMask);

			log << tcu::TestLog::EndImageSet;
		}
	}

	return result;
}